

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void DefaultFormatter::
     Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (ParamsStream<VectorWriter_&,_TransactionSerParams> *s,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *t)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<VectorWriter&,TransactionSerParams>>
            (s,(long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  puVar2 = (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    VectorWriter::write(s->m_substream,(int)puVar2,puVar3 + -(long)puVar2,in_RCX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Ser(Stream& s, const T& t) { Serialize(s, t); }